

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> * __thiscall
tinyusdz::lerp<std::array<double,4ul>>
          (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *a,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *b,double t)

{
  double *pdVar1;
  pointer paVar2;
  ulong uVar3;
  double4 *b_00;
  long lVar4;
  ulong __new_size;
  bool bVar5;
  double4 local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = *(long *)(this + 8) - *(long *)this >> 5;
  __new_size = (long)(a->
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar3 <= __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    b_00 = (double4 *)
           ((long)(a->
                  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
    if ((double4 *)(*(long *)(this + 8) - *(long *)this) == b_00) {
      lVar4 = 0;
      while (bVar5 = __new_size != 0, __new_size = __new_size - 1, bVar5) {
        lerp<std::array<double,4ul>>
                  (&local_50,(tinyusdz *)(*(long *)this + lVar4),
                   (double4 *)
                   ((long)((a->
                           super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar4),b_00,t);
        paVar2 = (__return_storage_ptr__->
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)paVar2->_M_elems + lVar4 + 0x10);
        *pdVar1 = local_50._M_elems[2];
        pdVar1[1] = local_50._M_elems[3];
        pdVar1 = (double *)((long)paVar2->_M_elems + lVar4);
        *pdVar1 = local_50._M_elems[0];
        pdVar1[1] = local_50._M_elems[1];
        lVar4 = lVar4 + 0x20;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}